

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O1

bool duckdb::Interval::FromString(string *str,interval_t *result)

{
  bool bVar1;
  string error_message;
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  bVar1 = FromCString((str->_M_dataplus)._M_p,str->_M_string_length,result,&local_30,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool Interval::FromString(const string &str, interval_t &result) {
	string error_message;
	return Interval::FromCString(str.c_str(), str.size(), result, &error_message, false);
}